

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O3

char * iutest::TestEnv::get_color_option(void)

{
  TestFlag *pTVar1;
  char *pcVar2;
  
  pTVar1 = TestFlag::GetInstance();
  if ((pTVar1->m_test_flags & 0x400) == 0) {
    pTVar1 = TestFlag::GetInstance();
    if ((pTVar1->m_test_flags & 0x100) == 0) {
      pTVar1 = TestFlag::GetInstance();
      pcVar2 = "no";
      if ((pTVar1->m_test_flags & 0x200) == 0) {
        pcVar2 = "auto";
      }
    }
    else {
      pcVar2 = "yes";
    }
  }
  else {
    pcVar2 = "ansi";
  }
  return pcVar2;
}

Assistant:

static const char* get_color_option()
    {
        if( TestFlag::IsEnableFlag(TestFlag::CONSOLE_COLOR_ANSI) )
        {
            return "ansi";
        }
        else if( TestFlag::IsEnableFlag(TestFlag::CONSOLE_COLOR_ON) )
        {
            return "yes";
        }
        else if( TestFlag::IsEnableFlag(TestFlag::CONSOLE_COLOR_OFF) )
        {
            return "no";
        }
        return "auto";
    }